

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cp.cpp
# Opt level: O2

bool __thiscall CmdCp::CopyDirectory(CmdCp *this,string *fileFrom,string *fileTo)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  FileType FVar2;
  string *fileFrom_00;
  _List_node_base *__return_storage_ptr__;
  string *this_00;
  string *fileTo_00;
  StrList l;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nextFileTo;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nextFileFrom;
  
  __return_storage_ptr__ = (_List_node_base *)&l;
  DirUtils::GetDirFiles((StrList *)__return_storage_ptr__,fileFrom);
  do {
    __return_storage_ptr__ =
         (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__return_storage_ptr__->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (__return_storage_ptr__ == (_List_node_base *)&l) {
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&l.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      return true;
    }
    std::operator+(&nextFileTo,fileFrom,'/');
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (__return_storage_ptr__ + 1);
    std::operator+(&nextFileFrom,&nextFileTo,__rhs);
    std::__cxx11::string::~string((string *)&nextFileTo);
    std::operator+(&local_70,fileTo,'/');
    std::operator+(&nextFileTo,&local_70,__rhs);
    std::__cxx11::string::~string((string *)&local_70);
    FVar2 = DirUtils::GetFileType(&nextFileFrom);
    if (FVar2 == DU_FILE) {
      std::__cxx11::string::string((string *)&local_f0,(string *)&nextFileFrom);
      fileTo_00 = &local_90;
      this_00 = fileTo_00;
      std::__cxx11::string::string((string *)fileTo_00,(string *)&nextFileTo);
      fileFrom_00 = &local_f0;
      CopyFile((CmdCp *)this_00,fileFrom_00,fileTo_00);
LAB_0010b6ff:
      std::__cxx11::string::~string((string *)fileTo_00);
      std::__cxx11::string::~string((string *)fileFrom_00);
    }
    else {
      bVar1 = std::operator==(__rhs,".");
      if (!bVar1) {
        bVar1 = std::operator==(__rhs,"..");
        if (!bVar1) {
          DirUtils::MakeDirectory(&nextFileTo);
          std::__cxx11::string::string((string *)&local_110,(string *)&nextFileFrom);
          fileTo_00 = &local_b0;
          std::__cxx11::string::string((string *)fileTo_00,(string *)&nextFileTo);
          fileFrom_00 = &local_110;
          CopyDirectory(this,fileFrom_00,fileTo_00);
          goto LAB_0010b6ff;
        }
      }
    }
    std::__cxx11::string::~string((string *)&nextFileTo);
    std::__cxx11::string::~string((string *)&nextFileFrom);
  } while( true );
}

Assistant:

bool CmdCp::CopyDirectory(string fileFrom, string fileTo){
	auto l = GetDirFiles(fileFrom);
	for(auto i = l.begin(); i != l.end(); i++){
		auto nextFileFrom = fileFrom + '/' + *i;
		auto nextFileTo = fileTo + '/' + *i;
		if(GetFileType(nextFileFrom) == DU_FILE){
			CopyFile(nextFileFrom, nextFileTo);
		}
		else{	/* recursion */
			if(*i == "." || *i == "..")continue;
			else{
				MakeDirectory(nextFileTo);
				CopyDirectory(nextFileFrom, nextFileTo);
			}
		}
	}
	return true;
}